

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefineDirectiveSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefineDirectiveSyntax,slang::syntax::DefineDirectiveSyntax_const&>
          (BumpAllocator *this,DefineDirectiveSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  size_t sVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  DefineDirectiveSyntax *pDVar10;
  
  pDVar10 = (DefineDirectiveSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefineDirectiveSyntax *)this->endPtr < pDVar10 + 1) {
    pDVar10 = (DefineDirectiveSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pDVar10 + 1);
  }
  (pDVar10->super_DirectiveSyntax).directive.info = (args->super_DirectiveSyntax).directive.info;
  SVar8 = (args->super_DirectiveSyntax).super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)&(args->super_DirectiveSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_DirectiveSyntax).super_SyntaxNode.parent;
  TVar4 = (args->super_DirectiveSyntax).directive.kind;
  uVar5 = (args->super_DirectiveSyntax).directive.field_0x2;
  NVar6.raw = (args->super_DirectiveSyntax).directive.numFlags.raw;
  uVar7 = (args->super_DirectiveSyntax).directive.rawLen;
  (pDVar10->super_DirectiveSyntax).super_SyntaxNode.previewNode =
       (args->super_DirectiveSyntax).super_SyntaxNode.previewNode;
  (pDVar10->super_DirectiveSyntax).directive.kind = TVar4;
  (pDVar10->super_DirectiveSyntax).directive.field_0x2 = uVar5;
  (pDVar10->super_DirectiveSyntax).directive.numFlags = (NumericTokenFlags)NVar6.raw;
  (pDVar10->super_DirectiveSyntax).directive.rawLen = uVar7;
  (pDVar10->super_DirectiveSyntax).super_SyntaxNode.kind = SVar8;
  *(undefined4 *)&(pDVar10->super_DirectiveSyntax).super_SyntaxNode.field_0x4 = uVar9;
  (pDVar10->super_DirectiveSyntax).super_SyntaxNode.parent = pSVar1;
  uVar5 = (args->name).field_0x2;
  NVar6.raw = (args->name).numFlags.raw;
  uVar7 = (args->name).rawLen;
  pIVar2 = (args->name).info;
  (pDVar10->name).kind = (args->name).kind;
  (pDVar10->name).field_0x2 = uVar5;
  (pDVar10->name).numFlags = (NumericTokenFlags)NVar6.raw;
  (pDVar10->name).rawLen = uVar7;
  (pDVar10->name).info = pIVar2;
  pDVar10->formalArguments = args->formalArguments;
  (pDVar10->body).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->body).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar9 = *(undefined4 *)&(args->body).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->body).super_SyntaxListBase.super_SyntaxNode.parent;
  (pDVar10->body).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->body).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar10->body).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar9;
  (pDVar10->body).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pDVar10->body).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_00698df0;
  (pDVar10->body).super_SyntaxListBase.childCount = (args->body).super_SyntaxListBase.childCount;
  sVar3 = (args->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  (pDVar10->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (args->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  (pDVar10->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar3;
  (pDVar10->body).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00699340;
  return pDVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }